

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

void __thiscall despot::POMDPX::InitTransitions(POMDPX *this)

{
  long lVar1;
  uint uVar2;
  pointer ppVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  log_ostream *plVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  best;
  vector<int,_std::allocator<int>_> state;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  local_80;
  _Vector_base<int,_std::allocator<int>_> local_68;
  State local_50;
  
  if (this->is_small_ != false) {
    dVar14 = get_time_second();
    uVar4 = (*(this->super_MDP)._vptr_MDP[2])(this);
    uVar5 = (*(this->super_MDP)._vptr_MDP[3])(this);
    std::
    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
    ::resize(&this->transition_probabilities_,(long)(int)uVar4);
    uVar13 = 0;
    uVar9 = 0;
    if (0 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
    }
    uVar2 = uVar4;
    if ((int)uVar4 < 1) {
      uVar2 = 0;
    }
    for (; uVar13 != uVar2; uVar13 = uVar13 + 1) {
      Parser::ComputeState((vector<int,_std::allocator<int>_> *)&local_68,this->parser_,(int)uVar13)
      ;
      std::
      vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      ::resize((this->transition_probabilities_).
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar13,(long)(int)uVar5);
      for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
        Parser::ComputeTopTransitions
                  (&local_80,this->parser_,(vector<int,_std::allocator<int>_> *)&local_68,
                   (ACT_TYPE)uVar12,(int)(500000 / (long)(int)uVar4));
        lVar11 = 0;
        for (uVar10 = 0;
            ppVar3 = local_80.
                     super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar10 < (ulong)((long)local_80.
                                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_80.
                                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar10 = uVar10 + 1) {
          lVar1 = *(long *)&(this->transition_probabilities_).
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar13].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          iVar6 = Parser::ComputeIndex
                            (this->parser_,
                             (vector<int,_std::allocator<int>_> *)
                             ((long)&((local_80.
                                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar11));
          State::State(&local_50,iVar6,*(double *)((long)&ppVar3->second + lVar11));
          std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                    ((vector<despot::State,_std::allocator<despot::State>_> *)
                     (lVar1 + uVar12 * 0x18),&local_50);
          State::~State(&local_50);
          lVar11 = lVar11 + 0x20;
        }
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ::~vector(&local_80);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    }
    iVar6 = logging::level();
    if (0 < iVar6) {
      iVar6 = logging::level();
      if (2 < iVar6) {
        plVar7 = logging::stream(3);
        std::operator<<(&plVar7->super_ostream,
                        "[POMDPX::InitTransitions] Initialized transition table in ");
        dVar15 = get_time_second();
        poVar8 = std::ostream::_M_insert<double>(dVar15 - dVar14);
        poVar8 = std::operator<<(poVar8,"s.");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
    return;
  }
  __assert_fail("is_small_",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x139,"void despot::POMDPX::InitTransitions()");
}

Assistant:

void POMDPX::InitTransitions() {
	assert(is_small_);

	double start = get_time_second();
	int num_states = NumStates(), num_actions = NumActions();
	transition_probabilities_.resize(num_states);
	for (int s = 0; s < num_states; s++) {
		vector<int> state = parser_->ComputeState(s);
		transition_probabilities_[s].resize(num_actions);
		for (int a = 0; a < num_actions; a++) {
			vector<pair<vector<int>, double> > best =
				parser_->ComputeTopTransitions(state, a, 500000 / num_states);
			for (int i = 0; i < best.size(); i++) {
				const pair<vector<int>, double>& pair = best[i];
				transition_probabilities_[s][a].push_back(
					State(parser_->ComputeIndex(pair.first), pair.second));
			}
		}
	}
	logi << "[POMDPX::InitTransitions] Initialized transition table in "
		<< (get_time_second() - start) << "s." << endl;
}